

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_generator.cc
# Opt level: O1

void grpc_go_generator::anon_unknown_0::GenerateServerMethodSignature
               (Method *method,Printer *printer,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *vars)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  int iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  long *local_d8 [2];
  long local_c8;
  undefined8 uStack_c0;
  key_type local_b8;
  long *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  Printer *local_78;
  key_type local_70;
  key_type local_50;
  
  local_78 = printer;
  (*(method->super_CommentHolder)._vptr_CommentHolder[5])(&local_98,method);
  plVar3 = local_98;
  local_d8[0] = &local_c8;
  if (local_90 == 0) {
    if (local_98 == (long *)&local_88) {
      local_c8 = CONCAT71(uStack_87,local_88);
      uStack_c0 = uStack_80;
    }
    else {
      local_d8[0] = local_98;
      local_c8 = CONCAT71(uStack_87,local_88);
    }
  }
  else {
    iVar4 = toupper((int)(char)*local_98);
    *(char *)plVar3 = (char)iVar4;
    if (local_98 == (long *)&local_88) {
      uStack_c0 = uStack_80;
    }
    else {
      local_d8[0] = local_98;
    }
    local_c8 = CONCAT71(uStack_87,local_88);
  }
  local_98 = (long *)&local_88;
  local_90 = 0;
  local_88 = 0;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Method","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != &local_c8) {
    operator_delete(local_d8[0],local_c8 + 1);
  }
  if (local_98 != (long *)&local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  (*(method->super_CommentHolder)._vptr_CommentHolder[0xb])(local_d8,method);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Request","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != &local_c8) {
    operator_delete(local_d8[0],local_c8 + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CustomMethodIO","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_b8);
  iVar4 = std::__cxx11::string::compare((char *)pmVar5);
  if (iVar4 == 0) {
    (*(method->super_CommentHolder)._vptr_CommentHolder[0xd])(local_d8,method);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CustomMethodIO","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_50);
    pcVar2 = (pmVar5->_M_dataplus)._M_p;
    local_d8[0] = &local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,pcVar2,pcVar2 + pmVar5->_M_string_length);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Response","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_70);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != &local_c8) {
    operator_delete(local_d8[0],local_c8 + 1);
  }
  if ((iVar4 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(method->super_CommentHolder)._vptr_CommentHolder[0xf])(method);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x10])(method);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(method->super_CommentHolder)._vptr_CommentHolder[0x11])(method);
      if ((char)iVar4 != '\0') {
        pcVar6 = "$Method$(*$Request$, $Service$_$Method$Server) error$Ending$";
        goto LAB_0034d3c9;
      }
    }
    pcVar6 = "$Method$($Service$_$Method$Server) error$Ending$";
  }
  else {
    pcVar6 = "$Method$($context$.Context, *$Request$) (*$Response$, error)$Ending$";
  }
LAB_0034d3c9:
  (*local_78->_vptr_Printer[2])(local_78,vars,pcVar6);
  return;
}

Assistant:

static void GenerateServerMethodSignature(const grpc_generator::Method *method,
                                   grpc_generator::Printer *printer,
                                   std::map<grpc::string, grpc::string> vars) {
  vars["Method"] = exportName(method->name());
  vars["Request"] = method->get_input_type_name();
  vars["Response"] = (vars["CustomMethodIO"] == "")
                         ? method->get_output_type_name()
                         : vars["CustomMethodIO"];
  if (method->NoStreaming()) {
    printer->Print(
        vars,
        "$Method$($context$.Context, *$Request$) (*$Response$, error)$Ending$");
  } else if (ServerOnlyStreaming(method)) {
    printer->Print(
        vars, "$Method$(*$Request$, $Service$_$Method$Server) error$Ending$");
  } else {
    printer->Print(vars, "$Method$($Service$_$Method$Server) error$Ending$");
  }
}